

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O1

int mbedtls_gcm_self_test(int verbose)

{
  uchar (*input) [64];
  int iVar1;
  size_t length;
  size_t iv_len;
  size_t add_len;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uchar (*iv) [64];
  uchar (*key) [32];
  uchar (*input_00) [64];
  uchar (*pauVar7) [16];
  uint keybits;
  ulong uVar8;
  uchar (*add) [64];
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uchar tag_buf [16];
  uchar buf [64];
  mbedtls_gcm_context ctx;
  
  lVar6 = 0;
  do {
    uVar8 = lVar6 * 0x40 + 0x80;
    uVar9 = 0;
    do {
      memset(&ctx,0,0x1a0);
      keybits = (uint)uVar8;
      if (verbose != 0) {
        printf("  AES-GCM-%3d #%d (%s): ",uVar8 & 0xffffffff,uVar9 & 0xffffffff,"enc");
      }
      key = ::key + key_index[uVar9];
      iVar3 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if (iVar3 == -0x23 && uVar8 == 0xc0) {
        puts("skipped");
        bVar2 = false;
        iVar3 = -0x23;
        goto LAB_0010adb9;
      }
      if (iVar3 != 0) goto LAB_0010adb4;
      length = pt_len[uVar9];
      iv = ::iv + iv_index[uVar9];
      iv_len = ::iv_len[uVar9];
      add = additional + add_index[uVar9];
      add_len = ::add_len[uVar9];
      iVar1 = key_index[uVar9];
      input = pt + iVar1;
      iVar3 = mbedtls_gcm_crypt_and_tag
                        (&ctx,1,length,*iv,iv_len,*add,add_len,*input,buf,0x10,tag_buf);
      if (iVar3 != 0) {
LAB_0010ad9f:
        bVar2 = true;
        goto LAB_0010adb9;
      }
      lVar5 = lVar6 * 6 + uVar9;
      input_00 = ct + lVar5;
      iVar3 = bcmp(buf,input_00,length);
      if ((iVar3 != 0) ||
         (auVar11[0] = -(tag[lVar5][0] == tag_buf[0]), auVar11[1] = -(tag[lVar5][1] == tag_buf[1]),
         auVar11[2] = -(tag[lVar5][2] == tag_buf[2]), auVar11[3] = -(tag[lVar5][3] == tag_buf[3]),
         auVar11[4] = -(tag[lVar5][4] == tag_buf[4]), auVar11[5] = -(tag[lVar5][5] == tag_buf[5]),
         auVar11[6] = -(tag[lVar5][6] == tag_buf[6]), auVar11[7] = -(tag[lVar5][7] == tag_buf[7]),
         auVar11[8] = -(tag[lVar5][8] == tag_buf[8]), auVar11[9] = -(tag[lVar5][9] == tag_buf[9]),
         auVar11[10] = -(tag[lVar5][10] == tag_buf[10]),
         auVar11[0xb] = -(tag[lVar5][0xb] == tag_buf[0xb]),
         auVar11[0xc] = -(tag[lVar5][0xc] == tag_buf[0xc]),
         auVar11[0xd] = -(tag[lVar5][0xd] == tag_buf[0xd]),
         auVar11[0xe] = -(tag[lVar5][0xe] == tag_buf[0xe]),
         auVar11[0xf] = -(tag[lVar5][0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar11[0xf] >> 7) << 0xf) != 0xffff)) {
LAB_0010ad94:
        iVar3 = 1;
        goto LAB_0010ad9f;
      }
      pauVar7 = tag + lVar5;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      lVar4 = 0;
      do {
        ctx.cipher_ctx.unprocessed_data[lVar4 + -0x20] = '\0';
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x1a0);
      if (verbose == 0) {
        memset(&ctx,0,0x1a0);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a0);
        printf("  AES-GCM-%3d #%d (%s): ",uVar8 & 0xffffffff,uVar9,"dec");
      }
      iVar3 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if (iVar3 != 0) goto LAB_0010adb4;
      iVar3 = mbedtls_gcm_crypt_and_tag
                        (&ctx,0,length,*iv,iv_len,*add,add_len,*input_00,buf,0x10,tag_buf);
      if (iVar3 != 0) goto LAB_0010ad9f;
      iVar3 = bcmp(buf,input,length);
      if ((iVar3 != 0) ||
         (auVar12[0] = -((*pauVar7)[0] == tag_buf[0]), auVar12[1] = -(tag[lVar5][1] == tag_buf[1]),
         auVar12[2] = -(tag[lVar5][2] == tag_buf[2]), auVar12[3] = -(tag[lVar5][3] == tag_buf[3]),
         auVar12[4] = -(tag[lVar5][4] == tag_buf[4]), auVar12[5] = -(tag[lVar5][5] == tag_buf[5]),
         auVar12[6] = -(tag[lVar5][6] == tag_buf[6]), auVar12[7] = -(tag[lVar5][7] == tag_buf[7]),
         auVar12[8] = -(tag[lVar5][8] == tag_buf[8]), auVar12[9] = -(tag[lVar5][9] == tag_buf[9]),
         auVar12[10] = -(tag[lVar5][10] == tag_buf[10]),
         auVar12[0xb] = -(tag[lVar5][0xb] == tag_buf[0xb]),
         auVar12[0xc] = -(tag[lVar5][0xc] == tag_buf[0xc]),
         auVar12[0xd] = -(tag[lVar5][0xd] == tag_buf[0xd]),
         auVar12[0xe] = -(tag[lVar5][0xe] == tag_buf[0xe]),
         auVar12[0xf] = -(tag[lVar5][0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar12[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_0010ad94;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      lVar4 = 0;
      do {
        ctx.cipher_ctx.unprocessed_data[lVar4 + -0x20] = '\0';
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x1a0);
      if (verbose == 0) {
        memset(&ctx,0,0x1a0);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a0);
        printf("  AES-GCM-%3d #%d split (%s): ",uVar8 & 0xffffffff,uVar9,"enc");
      }
      iVar3 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if (iVar3 != 0) goto LAB_0010adb4;
      iVar3 = mbedtls_gcm_starts(&ctx,1,*iv,iv_len,*add,add_len);
      if (iVar3 != 0) goto LAB_0010ad9f;
      if (uVar9 < 2) {
        iVar3 = mbedtls_gcm_update(&ctx,length,*input,buf);
        if (iVar3 != 0) goto LAB_0010adb4;
      }
      else {
        iVar3 = mbedtls_gcm_update(&ctx,0x20,*input,buf);
        if (iVar3 == 0) {
          iVar3 = mbedtls_gcm_update(&ctx,length - 0x20,pt[iVar1] + 0x20,buf + 0x20);
          bVar10 = iVar3 == 0;
          bVar2 = !bVar10;
        }
        else {
          bVar2 = true;
          bVar10 = false;
        }
        if (!bVar10) goto LAB_0010adb9;
      }
      iVar3 = mbedtls_gcm_finish(&ctx,tag_buf,0x10);
      if (iVar3 != 0) {
LAB_0010adb4:
        bVar2 = true;
        goto LAB_0010adb9;
      }
      iVar3 = bcmp(buf,input_00,length);
      if ((iVar3 != 0) ||
         (auVar13[0] = -((*pauVar7)[0] == tag_buf[0]), auVar13[1] = -(tag[lVar5][1] == tag_buf[1]),
         auVar13[2] = -(tag[lVar5][2] == tag_buf[2]), auVar13[3] = -(tag[lVar5][3] == tag_buf[3]),
         auVar13[4] = -(tag[lVar5][4] == tag_buf[4]), auVar13[5] = -(tag[lVar5][5] == tag_buf[5]),
         auVar13[6] = -(tag[lVar5][6] == tag_buf[6]), auVar13[7] = -(tag[lVar5][7] == tag_buf[7]),
         auVar13[8] = -(tag[lVar5][8] == tag_buf[8]), auVar13[9] = -(tag[lVar5][9] == tag_buf[9]),
         auVar13[10] = -(tag[lVar5][10] == tag_buf[10]),
         auVar13[0xb] = -(tag[lVar5][0xb] == tag_buf[0xb]),
         auVar13[0xc] = -(tag[lVar5][0xc] == tag_buf[0xc]),
         auVar13[0xd] = -(tag[lVar5][0xd] == tag_buf[0xd]),
         auVar13[0xe] = -(tag[lVar5][0xe] == tag_buf[0xe]),
         auVar13[0xf] = -(tag[lVar5][0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar13[0xf] >> 7) << 0xf) != 0xffff)) {
LAB_0010adae:
        iVar3 = 1;
        goto LAB_0010adb4;
      }
      mbedtls_cipher_free(&ctx.cipher_ctx);
      lVar4 = 0;
      do {
        ctx.cipher_ctx.unprocessed_data[lVar4 + -0x20] = '\0';
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x1a0);
      if (verbose == 0) {
        memset(&ctx,0,0x1a0);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a0);
        printf("  AES-GCM-%3d #%d split (%s): ",uVar8 & 0xffffffff,uVar9,"dec");
      }
      iVar3 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if ((iVar3 != 0) || (iVar3 = mbedtls_gcm_starts(&ctx,0,*iv,iv_len,*add,add_len), iVar3 != 0))
      goto LAB_0010adb4;
      if (uVar9 < 2) {
        iVar3 = mbedtls_gcm_update(&ctx,length,*input_00,buf);
        if (iVar3 != 0) goto LAB_0010adb4;
      }
      else {
        iVar3 = mbedtls_gcm_update(&ctx,0x20,*input_00,buf);
        if (iVar3 == 0) {
          iVar3 = mbedtls_gcm_update(&ctx,length - 0x20,ct[lVar5] + 0x20,buf + 0x20);
          bVar10 = iVar3 == 0;
          bVar2 = !bVar10;
        }
        else {
          bVar2 = true;
          bVar10 = false;
        }
        if (!bVar10) goto LAB_0010adb9;
      }
      iVar3 = mbedtls_gcm_finish(&ctx,tag_buf,0x10);
      if (iVar3 != 0) goto LAB_0010adb4;
      iVar3 = bcmp(buf,input,length);
      if (iVar3 != 0) goto LAB_0010adae;
      auVar14[0] = -((*pauVar7)[0] == tag_buf[0]);
      auVar14[1] = -(tag[lVar5][1] == tag_buf[1]);
      auVar14[2] = -(tag[lVar5][2] == tag_buf[2]);
      auVar14[3] = -(tag[lVar5][3] == tag_buf[3]);
      auVar14[4] = -(tag[lVar5][4] == tag_buf[4]);
      auVar14[5] = -(tag[lVar5][5] == tag_buf[5]);
      auVar14[6] = -(tag[lVar5][6] == tag_buf[6]);
      auVar14[7] = -(tag[lVar5][7] == tag_buf[7]);
      auVar14[8] = -(tag[lVar5][8] == tag_buf[8]);
      auVar14[9] = -(tag[lVar5][9] == tag_buf[9]);
      auVar14[10] = -(tag[lVar5][10] == tag_buf[10]);
      auVar14[0xb] = -(tag[lVar5][0xb] == tag_buf[0xb]);
      auVar14[0xc] = -(tag[lVar5][0xc] == tag_buf[0xc]);
      auVar14[0xd] = -(tag[lVar5][0xd] == tag_buf[0xd]);
      auVar14[0xe] = -(tag[lVar5][0xe] == tag_buf[0xe]);
      auVar14[0xf] = -(tag[lVar5][0xf] == tag_buf[0xf]);
      iVar3 = 1;
      bVar2 = true;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar14[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010adb9;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      lVar5 = 0;
      do {
        ctx.cipher_ctx.unprocessed_data[lVar5 + -0x20] = '\0';
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x1a0);
      if (verbose != 0) {
        puts("passed");
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 6);
    iVar3 = 0;
    bVar2 = false;
LAB_0010adb9:
    if (bVar2) {
      if (!bVar2) {
        return iVar3;
      }
      goto LAB_0010ae02;
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 3) {
      iVar3 = 0;
      if (verbose != 0) {
        putchar(10);
      }
LAB_0010ae02:
      if (iVar3 != 0) {
        if (verbose != 0) {
          puts("failed");
        }
        mbedtls_cipher_free(&ctx.cipher_ctx);
        lVar6 = 0;
        do {
          ctx.cipher_ctx.unprocessed_data[lVar6 + -0x20] = '\0';
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x1a0);
      }
      return iVar3;
    }
  } while( true );
}

Assistant:

int mbedtls_gcm_self_test( int verbose )
{
    mbedtls_gcm_context ctx;
    unsigned char buf[64];
    unsigned char tag_buf[16];
    int i, j, ret;
    mbedtls_cipher_id_t cipher = MBEDTLS_CIPHER_ID_AES;

    for( j = 0; j < 3; j++ )
    {
        int key_len = 128 + 64 * j;

        for( i = 0; i < MAX_TESTS; i++ )
        {
            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                key_len, i, "enc" );

            ret = mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]],
                                      key_len );
            /*
             * AES-192 is an optional feature that may be unavailable when
             * there is an alternative underlying implementation i.e. when
             * MBEDTLS_AES_ALT is defined.
             */
            if( ret == MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE && key_len == 192 )
            {
                mbedtls_printf( "skipped\n" );
                break;
            }
            else if( ret != 0 )
            {
                goto exit;
            }

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_ENCRYPT,
                                        pt_len[i],
                                        iv[iv_index[i]], iv_len[i],
                                        additional[add_index[i]], add_len[i],
                                        pt[pt_index[i]], buf, 16, tag_buf );
            if( ret != 0 )
                goto exit;

            if ( memcmp( buf, ct[j * 6 + i], pt_len[i] ) != 0 ||
                 memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                key_len, i, "dec" );

            ret = mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_DECRYPT,
                                        pt_len[i],
                                        iv[iv_index[i]], iv_len[i],
                                        additional[add_index[i]], add_len[i],
                                        ct[j * 6 + i], buf, 16, tag_buf );

            if( ret != 0 )
                goto exit;

            if( memcmp( buf, pt[pt_index[i]], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                key_len, i, "enc" );

            ret = mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_ENCRYPT,
                                      iv[iv_index[i]], iv_len[i],
                                      additional[add_index[i]], add_len[i] );
            if( ret != 0 )
                goto exit;

            if( pt_len[i] > 32 )
            {
                size_t rest_len = pt_len[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, pt[pt_index[i]], buf );
                if( ret != 0 )
                    goto exit;

                ret = mbedtls_gcm_update( &ctx, rest_len, pt[pt_index[i]] + 32,
                                  buf + 32 );
                if( ret != 0 )
                    goto exit;
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len[i], pt[pt_index[i]], buf );
                if( ret != 0 )
                    goto exit;
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 )
                goto exit;

            if( memcmp( buf, ct[j * 6 + i], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                key_len, i, "dec" );

            ret = mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_DECRYPT,
                              iv[iv_index[i]], iv_len[i],
                              additional[add_index[i]], add_len[i] );
            if( ret != 0 )
                goto exit;

            if( pt_len[i] > 32 )
            {
                size_t rest_len = pt_len[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, ct[j * 6 + i], buf );
                if( ret != 0 )
                    goto exit;

                ret = mbedtls_gcm_update( &ctx, rest_len, ct[j * 6 + i] + 32,
                                          buf + 32 );
                if( ret != 0 )
                    goto exit;
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len[i], ct[j * 6 + i],
                                          buf );
                if( ret != 0 )
                    goto exit;
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 )
                goto exit;

            if( memcmp( buf, pt[pt_index[i]], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    ret = 0;

exit:
    if( ret != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );
        mbedtls_gcm_free( &ctx );
    }

    return( ret );
}